

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::InsertShiftedInfo
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t indent_length,GeneratedCodeInfo *target_info)

{
  int iVar1;
  Rep *pRVar2;
  GeneratedCodeInfo_Annotation *from;
  uint uVar3;
  long lVar4;
  void **ppvVar5;
  GeneratedCodeInfo_Annotation *pGVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  void **ppvVar10;
  
  pRVar2 = (this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar4 = (long)(this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.current_size_;
  if (lVar4 != 0) {
    ppvVar5 = ppvVar10 + lVar4;
    lVar4 = insertion_offset + indent_length;
    uVar8 = 0;
    do {
      from = (GeneratedCodeInfo_Annotation *)*ppvVar10;
      pRVar2 = (target_info->annotation_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar2 == (Rep *)0x0) {
LAB_0022cf53:
        pGVar6 = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                           ((target_info->annotation_).super_RepeatedPtrFieldBase.arena_);
        pGVar6 = (GeneratedCodeInfo_Annotation *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(target_info->annotation_).super_RepeatedPtrFieldBase,pGVar6);
      }
      else {
        iVar1 = (target_info->annotation_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar2->allocated_size <= iVar1) goto LAB_0022cf53;
        (target_info->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pGVar6 = (GeneratedCodeInfo_Annotation *)pRVar2->elements[iVar1];
      }
      uVar7 = (ulong)from->end_;
      if (uVar8 < uVar7) {
        uVar3 = 0;
        do {
          uVar9 = uVar8;
          if (insertion_content->_M_string_length - 1 <= uVar8) break;
          if ((insertion_content->_M_dataplus)._M_p[uVar8] == '\n') {
            if (uVar8 < (ulong)(long)from->begin_) {
              lVar4 = lVar4 + indent_length;
            }
            else {
              uVar3 = uVar3 + (int)indent_length;
            }
          }
          uVar8 = uVar8 + 1;
          uVar9 = uVar7;
        } while (uVar7 != uVar8);
        uVar7 = (ulong)uVar3;
        uVar8 = uVar9;
      }
      else {
        uVar7 = 0;
      }
      GeneratedCodeInfo_Annotation::CopyFrom(pGVar6,from);
      pGVar6->begin_ = pGVar6->begin_ + (int)lVar4;
      *(byte *)(pGVar6->_has_bits_).has_bits_ = (byte)(pGVar6->_has_bits_).has_bits_[0] | 6;
      lVar4 = lVar4 + uVar7;
      pGVar6->end_ = pGVar6->end_ + (int)lVar4;
      ppvVar10 = ppvVar10 + 1;
    } while (ppvVar10 != ppvVar5);
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::InsertShiftedInfo(
    const std::string& insertion_content, size_t insertion_offset,
    size_t indent_length, google::protobuf::GeneratedCodeInfo& target_info) {
  // Keep track of how much extra data was added for indents before the
  // current annotation being inserted. `pos` and `source_annotation.begin()`
  // are offsets in `insertion_content`. `insertion_offset` is updated so that
  // it can be added to an annotation's `begin` field to reflect that
  // annotation's updated location after `insertion_content` was inserted into
  // the target file.
  size_t pos = 0;
  insertion_offset += indent_length;
  for (const auto& source_annotation : info_to_insert_.annotation()) {
    GeneratedCodeInfo::Annotation* annotation = target_info.add_annotation();
    int inner_indent = 0;
    // insertion_content is guaranteed to end in an endline. This last endline
    // has no effect on indentation.
    for (; pos < source_annotation.end() && pos < insertion_content.size() - 1;
         ++pos) {
      if (insertion_content[pos] == '\n') {
        if (pos >= source_annotation.begin()) {
          // The beginning of the annotation is at insertion_offset, but the end
          // can still move further in the target file.
          inner_indent += indent_length;
        } else {
          insertion_offset += indent_length;
        }
      }
    }
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + insertion_offset);
    insertion_offset += inner_indent;
    annotation->set_end(annotation->end() + insertion_offset);
  }
}